

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

text_input_buffer * __thiscall dtc::text_input_buffer::next_token(text_input_buffer *this)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  byte local_33;
  byte local_32;
  byte local_31;
  int start;
  text_input_buffer *self;
  text_input_buffer *this_local;
  
  do {
    iVar1 = this->cursor;
    skip_spaces(this);
    bVar2 = finished(this);
    if (bVar2) {
      return this;
    }
    cVar3 = operator*(this);
    if ((cVar3 == '/') && (cVar3 = peek(this), cVar3 == '*')) {
      operator++(this);
      operator++(this);
      do {
        while( true ) {
          cVar3 = operator*(this);
          local_31 = 0;
          if (cVar3 != '\0') {
            cVar3 = operator*(this);
            local_31 = 0;
            if (cVar3 != '*') {
              bVar2 = finished(this);
              local_31 = bVar2 ^ 0xff;
            }
          }
          if ((local_31 & 1) == 0) break;
          operator++(this);
        }
        operator++(this);
        cVar3 = operator*(this);
        local_32 = 0;
        if (cVar3 != '\0') {
          cVar3 = operator*(this);
          local_32 = 0;
          if (cVar3 != '/') {
            bVar2 = finished(this);
            local_32 = bVar2 ^ 0xff;
          }
        }
      } while ((local_32 & 1) != 0);
      operator++(this);
    }
    cVar3 = operator*(this);
    if ((cVar3 == '/') && (cVar3 = peek(this), cVar3 == '/')) {
      operator++(this);
      operator++(this);
      while( true ) {
        cVar3 = operator*(this);
        local_33 = 0;
        if (cVar3 != '\n') {
          bVar2 = finished(this);
          local_33 = bVar2 ^ 0xff;
        }
        if ((local_33 & 1) == 0) break;
        operator++(this);
      }
      operator++(this);
    }
  } while (iVar1 != this->cursor);
  return this;
}

Assistant:

text_input_buffer&
text_input_buffer::next_token()
{
	auto &self = *this;
	int start;
	do {
		start = cursor;
		skip_spaces();
		if (finished())
		{
			return self;
		}
		// Parse /* comments
		if (*self == '/' && peek() == '*')
		{
			// eat the start of the comment
			++self;
			++self;
			do {
				// Find the ending * of */
				while ((*self != '\0') && (*self != '*') && !finished())
				{
					++self;
				}
				// Eat the *
				++self;
			} while ((*self != '\0') && (*self != '/') && !finished());
			// Eat the /
			++self;
		}
		// Parse // comments
		if ((*self == '/' && peek() == '/'))
		{
			// eat the start of the comment
			++self;
			++self;
			// Find the ending of the line
			while (*self != '\n' && !finished())
			{
				++self;
			}
			// Eat the \n
			++self;
		}
	} while (start != cursor);
	return self;
}